

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-xtra.h
# Opt level: O3

Expression eq(Expression *expr,float value,float epsilon)

{
  undefined8 extraout_RDX;
  Expression *in_RSI;
  Expression EVar1;
  expr local_80 [16];
  Expression local_70;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  Expression local_30;
  
  dynet::expr::operator-(&local_50,value - epsilon);
  dynet::expr::rectify(&local_40);
  dynet::expr::operator-(local_80,in_RSI);
  dynet::expr::operator+(&local_70,value + epsilon);
  dynet::expr::rectify(&local_60);
  dynet::expr::min(&local_30,&local_40);
  dynet::expr::operator*(expr,1.0 / epsilon);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)expr;
  return EVar1;
}

Assistant:

Expression eq(const Expression &expr, float value, float epsilon=0.1) 
{
    return min(rectify(expr - (value - epsilon)), rectify(-expr + (value + epsilon))) / epsilon; 
}